

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

XMLCh __thiscall xercesc_4_0::ReaderMgr::skipUntilIn(ReaderMgr *this,XMLCh *listToSkip)

{
  XMLCh ch;
  int iVar1;
  
  ch = peekNextChar(this);
  while( true ) {
    if (ch == L'\0') {
      return L'\0';
    }
    iVar1 = XMLString::indexOf(listToSkip,ch);
    if (iVar1 != -1) break;
    getNextChar(this);
    ch = peekNextChar(this);
  }
  return ch;
}

Assistant:

XMLCh ReaderMgr::skipUntilIn(const XMLCh* const listToSkip)
{
    XMLCh nextCh;
    // If we get an end of file char, then return
    while ((nextCh = peekNextChar())!=0)
    {
        if (XMLString::indexOf(listToSkip, nextCh) != -1)
            break;

        // Its one of ours so eat it
        getNextChar();
    }
    return nextCh;
}